

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QSslCipher>::emplace<QSslCipher_const&>
          (QMovableArrayOps<QSslCipher> *this,qsizetype i,QSslCipher *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QSslCipher *pQVar4;
  Inserter *in_RDX;
  QSslCipher *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QSslCipher tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QSslCipher>::needsDetach((QArrayDataPointer<QSslCipher> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QSslCipher>::freeSpaceAtEnd
                          ((QArrayDataPointer<QSslCipher> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QSslCipher>::end((QArrayDataPointer<QSslCipher> *)in_RDI);
      QSslCipher::QSslCipher(pQVar4,(QSslCipher *)in_RDX);
      in_RDI->displaceTo = in_RDI->displaceTo + 1;
      goto LAB_0012a84a;
    }
    if ((in_RSI == (QSslCipher *)0x0) &&
       (qVar3 = QArrayDataPointer<QSslCipher>::freeSpaceAtBegin
                          ((QArrayDataPointer<QSslCipher> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QSslCipher>::begin((QArrayDataPointer<QSslCipher> *)0x12a724);
      QSslCipher::QSslCipher(pQVar4 + -8,(QSslCipher *)in_RDX);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -8;
      in_RDI->displaceTo = in_RDI->displaceTo + 1;
      goto LAB_0012a84a;
    }
  }
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)&local_10,(QSslCipher *)in_RDX);
  bVar5 = in_RDI->displaceTo != (QSslCipher *)0x0;
  uVar6 = bVar5 && in_RSI == (QSslCipher *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QSslCipher *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QSslCipher>::detachAndGrow
            ((QArrayDataPointer<QSslCipher> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QSslCipher **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QSslCipher> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QSslCipher> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QSslCipher *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(in_RDI);
  }
  else {
    pQVar4 = QArrayDataPointer<QSslCipher>::begin((QArrayDataPointer<QSslCipher> *)0x12a7de);
    QSslCipher::QSslCipher(pQVar4 + -8,(QSslCipher *)&local_10);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -8;
    in_RDI->displaceTo = in_RDI->displaceTo + 1;
  }
  QSslCipher::~QSslCipher((QSslCipher *)&local_10);
LAB_0012a84a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }